

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NewFrame(void)

{
  ImDrawList *this;
  float *pfVar1;
  bool *pbVar2;
  ImGuiID *pIVar3;
  ImVec2 *pIVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar78;
  ImRect IVar7;
  undefined8 uVar79;
  ImGuiID IVar8;
  ImFontAtlas *pIVar9;
  uchar *puVar10;
  ImGuiWindow **ppIVar11;
  ImGuiPopupRef *__src;
  undefined1 auVar12 [12];
  ImGuiContext *pIVar13;
  ImGuiContext *pIVar14;
  ImGuiContext *pIVar15;
  ImGuiID IVar16;
  bool bVar17;
  int i;
  ImGuiInputSource IVar18;
  int iVar19;
  long lVar20;
  char *pcVar21;
  size_t sVar22;
  char *__s;
  char *pcVar23;
  ImGuiSettingsHandler *pIVar24;
  void *pvVar25;
  ImFont *font;
  ImGuiNavMoveResult *pIVar26;
  ImGuiWindow *pIVar27;
  ImGuiWindow **__dest;
  ImGuiPopupRef *__dest_00;
  bool bVar28;
  int i_1;
  ImGuiID IVar29;
  char *pcVar30;
  ImGuiWindow *pIVar31;
  ImGuiID IVar32;
  ImGuiWindow *parent_window;
  ulong uVar33;
  long lVar34;
  int iVar35;
  ImGuiContext *g_6;
  ImGuiContext *g_1;
  ImGuiID IVar36;
  float *pfVar37;
  ImGuiNavMoveResult *pIVar38;
  ulong uVar39;
  ImGuiWindow *pIVar40;
  float *pfVar41;
  ImGuiContext *g;
  char *pcVar42;
  ImGuiWindow *old_nav_window;
  char *pcVar43;
  ImGuiContext *g_2;
  char *pcVar44;
  ImGuiWindow **ppIVar45;
  ImGuiPopupRef *pIVar46;
  bool bVar47;
  byte bVar48;
  uint uVar49;
  uint uVar50;
  float fVar51;
  ImVec2 IVar52;
  ImVec2 IVar53;
  ImVec2 IVar54;
  ImVec2 IVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar58;
  float fVar59;
  ImVec2 IVar60;
  ImVec2 IVar61;
  ImVec2 IVar62;
  ImVec2 IVar63;
  undefined1 auVar64 [16];
  float fVar65;
  ImVec2 IVar66;
  undefined1 auVar67 [16];
  float fVar68;
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar69 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  ImVec2 local_38;
  
  pIVar13 = GImGui;
  bVar48 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() or ImGui::SetCurrentContext()?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd63,"void ImGui::NewFrame()");
  }
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd68,"void ImGui::NewFrame()");
  }
  fVar65 = (GImGui->IO).DeltaTime;
  if (fVar65 < 0.0) {
    __assert_fail("g.IO.DeltaTime >= 0.0f && \"Need a positive DeltaTime (zero is tolerated but will cause some timing issues)\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd69,"void ImGui::NewFrame()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd6a,"void ImGui::NewFrame()");
  }
  pIVar9 = (GImGui->IO).Fonts;
  if ((pIVar9->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd6b,"void ImGui::NewFrame()");
  }
  if ((*(pIVar9->Fonts).Data)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd6c,"void ImGui::NewFrame()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd6d,"void ImGui::NewFrame()");
  }
  fVar58 = (GImGui->Style).Alpha;
  if ((fVar58 < 0.0) || (1.0 < fVar58)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd6e,"void ImGui::NewFrame()");
  }
  if ((GImGui->FrameCount != 0) && (GImGui->FrameCountEnded != GImGui->FrameCount)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd6f,"void ImGui::NewFrame()");
  }
  lVar20 = 0;
  do {
    if (0x200 < (GImGui->IO).KeyMap[lVar20] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown)/sizeof(*g.IO.KeysDown))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0xd71,"void ImGui::NewFrame()");
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 0x15);
  if ((((GImGui->IO).ConfigFlags & 1) != 0) && ((GImGui->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd75,"void ImGui::NewFrame()");
  }
  if (GImGui->SettingsLoaded == false) {
    if ((GImGui->SettingsWindows).Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0xd7a,"void ImGui::NewFrame()");
    }
    pcVar21 = (GImGui->IO).IniFilename;
    if ((pcVar21 != (char *)0x0) &&
       (pcVar21 = (char *)ImFileLoadToMemory(pcVar21,"rb",(int *)0x0,1), pcVar21 != (char *)0x0)) {
      sVar22 = strlen(pcVar21);
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
      __s = (char *)(*GImAllocatorAllocFunc)(sVar22 + 1,GImAllocatorUserData);
      memcpy(__s,pcVar21,sVar22 + 1);
      sVar22 = strlen(__s);
      pIVar14 = GImGui;
      if (0 < (long)sVar22) {
        pcVar42 = __s + sVar22;
        pvVar25 = (void *)0x0;
        pIVar24 = (ImGuiSettingsHandler *)0x0;
        pcVar30 = __s;
LAB_0014a8cb:
        pcVar23 = pcVar30 + 2;
        pcVar43 = pcVar30 + 3;
        for (; (*pcVar30 == '\n' || (*pcVar30 == '\r')); pcVar30 = pcVar30 + 1) {
          pcVar23 = pcVar23 + 1;
          pcVar43 = pcVar43 + 1;
        }
        if (pcVar30 < pcVar42) {
          uVar33 = 0;
          do {
            if ((pcVar30[uVar33] == '\n') || (pcVar30[uVar33] == '\r')) break;
            lVar20 = uVar33 + 1;
            uVar33 = uVar33 + 1;
          } while (pcVar30 + lVar20 < pcVar42);
          pcVar44 = pcVar30 + uVar33;
          *pcVar44 = '\0';
          if (((uVar33 == 0) || (*pcVar30 != '[')) || (pcVar30[uVar33 - 1] != ']'))
          goto LAB_0014a964;
          pcVar30[uVar33 - 1] = '\0';
          if (2 < uVar33) {
            lVar20 = uVar33 - 2;
            lVar34 = uVar33 - 3;
            do {
              if (pcVar23[-1] == ']') {
                if (pcVar23 < pcVar30 + (uVar33 - 1)) goto LAB_0014a98e;
                break;
              }
              pcVar23 = pcVar23 + 1;
              pcVar43 = pcVar43 + 1;
              lVar34 = lVar34 + -1;
              lVar20 = lVar20 + -1;
            } while (lVar20 != 0);
          }
          goto LAB_0014a99d;
        }
        *pcVar30 = '\0';
        pcVar44 = pcVar30;
LAB_0014a964:
        if ((pIVar24 != (ImGuiSettingsHandler *)0x0) && (pvVar25 != (void *)0x0)) {
          (*pIVar24->ReadLineFn)(pIVar14,pIVar24,pvVar25,pcVar30);
        }
        goto LAB_0014a97b;
      }
LAB_0014a9d5:
      if (__s != (char *)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(__s,GImAllocatorUserData);
      pIVar14->SettingsLoaded = true;
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      (*GImAllocatorFreeFunc)(pcVar21,GImAllocatorUserData);
    }
    pIVar13->SettingsLoaded = true;
    fVar65 = (pIVar13->IO).DeltaTime;
  }
  if ((0.0 < pIVar13->SettingsDirtyTimer) &&
     (fVar58 = pIVar13->SettingsDirtyTimer - fVar65, pIVar13->SettingsDirtyTimer = fVar58,
     fVar58 <= 0.0)) {
    SaveIniSettingsToDisk((pIVar13->IO).IniFilename);
    fVar65 = (pIVar13->IO).DeltaTime;
  }
  pIVar13->Time = fVar65 + pIVar13->Time;
  pIVar13->FrameCount = pIVar13->FrameCount + 1;
  pIVar13->TooltipOverrideCount = 0;
  pIVar13->WindowsActiveCount = 0;
  font = GetDefaultFont();
  SetCurrentFont(font);
  if (pIVar13->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd8d,"void ImGui::NewFrame()");
  }
  fVar65 = (pIVar13->IO).DisplaySize.x;
  fVar58 = (pIVar13->IO).DisplaySize.y;
  (pIVar13->DrawListSharedData).ClipRectFullscreen.x = 0.0;
  (pIVar13->DrawListSharedData).ClipRectFullscreen.y = 0.0;
  (pIVar13->DrawListSharedData).ClipRectFullscreen.z = fVar65;
  (pIVar13->DrawListSharedData).ClipRectFullscreen.w = fVar58;
  (pIVar13->DrawListSharedData).CurveTessellationTol = (pIVar13->Style).CurveTessellationTol;
  this = &pIVar13->OverlayDrawList;
  ImDrawList::Clear(this);
  ImDrawList::PushTextureID(this,((pIVar13->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(this);
  (pIVar13->OverlayDrawList).Flags =
       (uint)(pIVar13->Style).AntiAliasedLines + (uint)(pIVar13->Style).AntiAliasedFill * 2;
  (pIVar13->DrawData).Valid = false;
  (pIVar13->DrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar13->DrawData).CmdListsCount = 0;
  (pIVar13->DrawData).TotalIdxCount = 0;
  (pIVar13->DrawData).TotalVtxCount = 0;
  if (pIVar13->HoveredIdPreviousFrame == 0) {
    pIVar13->HoveredIdTimer = 0.0;
  }
  pIVar13->HoveredIdPreviousFrame = pIVar13->HoveredId;
  pIVar13->HoveredId = 0;
  pIVar13->HoveredIdAllowOverlap = false;
  pIVar14 = GImGui;
  if ((pIVar13->ActiveIdIsAlive == false) &&
     (pIVar13->ActiveId != 0 && pIVar13->ActiveIdPreviousFrame == pIVar13->ActiveId)) {
    bVar47 = GImGui->ActiveId != 0;
    GImGui->ActiveIdIsJustActivated = bVar47;
    if (bVar47) {
      pIVar14->ActiveIdTimer = 0.0;
    }
    pIVar14->ActiveId = 0;
    pIVar14->ActiveIdAllowNavDirFlags = 0;
    pIVar14->ActiveIdAllowOverlap = false;
    pIVar14->ActiveIdWindow = (ImGuiWindow *)0x0;
  }
  IVar8 = pIVar13->ActiveId;
  if (IVar8 != 0) {
    pIVar13->ActiveIdTimer = (pIVar13->IO).DeltaTime + pIVar13->ActiveIdTimer;
  }
  pIVar13->ActiveIdPreviousFrame = IVar8;
  pIVar13->ActiveIdIsAlive = false;
  pIVar13->ActiveIdIsJustActivated = false;
  if (IVar8 != pIVar13->ScalarAsInputTextId && pIVar13->ScalarAsInputTextId != 0) {
    pIVar13->ScalarAsInputTextId = 0;
  }
  pIVar14 = GImGui;
  if ((pIVar13->DragDropActive == true) &&
     ((pIVar13->DragDropPayload).DataFrameCount + 1 < pIVar13->FrameCount)) {
    GImGui->DragDropActive = false;
    (pIVar14->DragDropPayload).DataType[0] = '\0';
    (pIVar14->DragDropPayload).DataType[1] = '\0';
    (pIVar14->DragDropPayload).DataType[2] = '\0';
    (pIVar14->DragDropPayload).DataType[3] = '\0';
    (pIVar14->DragDropPayload).DataType[4] = '\0';
    (pIVar14->DragDropPayload).DataType[5] = '\0';
    (pIVar14->DragDropPayload).DataType[6] = '\0';
    (pIVar14->DragDropPayload).DataType[7] = '\0';
    (pIVar14->DragDropPayload).DataType[8] = '\0';
    (pIVar14->DragDropPayload).DataType[9] = '\0';
    (pIVar14->DragDropPayload).DataType[10] = '\0';
    (pIVar14->DragDropPayload).DataType[0xb] = '\0';
    (pIVar14->DragDropPayload).DataType[0xc] = '\0';
    (pIVar14->DragDropPayload).DataType[0xd] = '\0';
    (pIVar14->DragDropPayload).DataType[0xe] = '\0';
    (pIVar14->DragDropPayload).DataType[0xf] = '\0';
    (pIVar14->DragDropPayload).DataType[0x10] = '\0';
    (pIVar14->DragDropPayload).DataType[0x11] = '\0';
    (pIVar14->DragDropPayload).DataType[0x12] = '\0';
    (pIVar14->DragDropPayload).DataType[0x13] = '\0';
    (pIVar14->DragDropPayload).DataType[0x14] = '\0';
    (pIVar14->DragDropPayload).DataType[0x15] = '\0';
    (pIVar14->DragDropPayload).DataType[0x16] = '\0';
    (pIVar14->DragDropPayload).DataType[0x17] = '\0';
    (pIVar14->DragDropPayload).DataType[0x18] = '\0';
    (pIVar14->DragDropPayload).DataType[0x19] = '\0';
    (pIVar14->DragDropPayload).DataType[0x1a] = '\0';
    (pIVar14->DragDropPayload).DataType[0x1b] = '\0';
    (pIVar14->DragDropPayload).DataType[0x1c] = '\0';
    (pIVar14->DragDropPayload).DataType[0x1d] = '\0';
    (pIVar14->DragDropPayload).DataType[0x1e] = '\0';
    (pIVar14->DragDropPayload).DataType[0x1f] = '\0';
    (pIVar14->DragDropPayload).DataType[0x20] = '\0';
    (pIVar14->DragDropPayload).Data = (void *)0x0;
    (pIVar14->DragDropPayload).DataSize = 0;
    (pIVar14->DragDropPayload).SourceId = 0;
    (pIVar14->DragDropPayload).SourceParentId = 0;
    (pIVar14->DragDropPayload).DataFrameCount = -1;
    (pIVar14->DragDropPayload).Preview = false;
    (pIVar14->DragDropPayload).Delivery = false;
    pIVar14->DragDropAcceptIdPrev = 0;
    pIVar14->DragDropAcceptFrameCount = -1;
    pIVar14->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
    pIVar14->DragDropAcceptIdCurr = 0;
    puVar10 = (pIVar13->DragDropPayloadBufHeap).Data;
    if (puVar10 != (uchar *)0x0) {
      (pIVar13->DragDropPayloadBufHeap).Size = 0;
      (pIVar13->DragDropPayloadBufHeap).Capacity = 0;
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      (*GImAllocatorFreeFunc)(puVar10,GImAllocatorUserData);
      (pIVar13->DragDropPayloadBufHeap).Data = (uchar *)0x0;
    }
    pIVar13->DragDropPayloadBufLocal[0] = '\0';
    pIVar13->DragDropPayloadBufLocal[1] = '\0';
    pIVar13->DragDropPayloadBufLocal[2] = '\0';
    pIVar13->DragDropPayloadBufLocal[3] = '\0';
    pIVar13->DragDropPayloadBufLocal[4] = '\0';
    pIVar13->DragDropPayloadBufLocal[5] = '\0';
    pIVar13->DragDropPayloadBufLocal[6] = '\0';
    pIVar13->DragDropPayloadBufLocal[7] = '\0';
  }
  pIVar13->DragDropAcceptIdPrev = pIVar13->DragDropAcceptIdCurr;
  pIVar13->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar13->DragDropAcceptIdCurr = 0;
  pfVar1 = (pIVar13->IO).KeysDownDuration;
  memcpy((pIVar13->IO).KeysDownDurationPrev,pfVar1,0x800);
  lVar20 = 0;
  do {
    fVar65 = -1.0;
    if ((pIVar13->IO).KeysDown[lVar20] == true) {
      fVar65 = 0.0;
      if (0.0 <= pfVar1[lVar20]) {
        fVar65 = pfVar1[lVar20] + (pIVar13->IO).DeltaTime;
      }
    }
    pfVar1[lVar20] = fVar65;
    pIVar14 = GImGui;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 0x200);
  (GImGui->IO).WantSetMousePos = false;
  uVar49 = (pIVar14->IO).ConfigFlags;
  if ((((uVar49 & 2) != 0) && (((pIVar14->IO).BackendFlags & 1) != 0)) &&
     ((0.0 < (pIVar14->IO).NavInputs[0] ||
      (((0.0 < (pIVar14->IO).NavInputs[2] || (0.0 < (pIVar14->IO).NavInputs[1])) ||
       (0.0 < (pIVar14->IO).NavInputs[3])))))) {
    pIVar14->NavInputSource = ImGuiInputSource_NavGamepad;
  }
  if ((uVar49 & 1) != 0) {
    uVar49 = (pIVar14->IO).KeyMap[0xc];
    if (-1 < (long)(int)uVar49) {
      if (0x1ff < uVar49) goto LAB_0014ce50;
      if ((pIVar14->IO).KeysDown[(int)uVar49] == true) {
        (pIVar14->IO).NavInputs[0] = 1.0;
        pIVar14->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar49 = (pIVar14->IO).KeyMap[0xd];
    if (-1 < (long)(int)uVar49) {
      if (0x1ff < uVar49) goto LAB_0014ce50;
      if ((pIVar14->IO).KeysDown[(int)uVar49] == true) {
        (pIVar14->IO).NavInputs[2] = 1.0;
        pIVar14->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar49 = (pIVar14->IO).KeyMap[0xe];
    if (-1 < (long)(int)uVar49) {
      if (0x1ff < uVar49) goto LAB_0014ce50;
      if ((pIVar14->IO).KeysDown[(int)uVar49] == true) {
        (pIVar14->IO).NavInputs[1] = 1.0;
        pIVar14->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar49 = (pIVar14->IO).KeyMap[1];
    if (-1 < (long)(int)uVar49) {
      if (0x1ff < uVar49) goto LAB_0014ce50;
      if ((pIVar14->IO).KeysDown[(int)uVar49] == true) {
        (pIVar14->IO).NavInputs[0x11] = 1.0;
        pIVar14->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar49 = (pIVar14->IO).KeyMap[2];
    if (-1 < (long)(int)uVar49) {
      if (0x1ff < uVar49) goto LAB_0014ce50;
      if ((pIVar14->IO).KeysDown[(int)uVar49] == true) {
        (pIVar14->IO).NavInputs[0x12] = 1.0;
        pIVar14->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar49 = (pIVar14->IO).KeyMap[3];
    if (-1 < (long)(int)uVar49) {
      if (0x1ff < uVar49) goto LAB_0014ce50;
      if ((pIVar14->IO).KeysDown[(int)uVar49] == true) {
        (pIVar14->IO).NavInputs[0x13] = 1.0;
        pIVar14->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar49 = (pIVar14->IO).KeyMap[4];
    if (-1 < (long)(int)uVar49) {
      if (0x1ff < uVar49) {
LAB_0014ce50:
        __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(GImGui->IO.KeysDown)/sizeof(*GImGui->IO.KeysDown)))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                      ,0x11d0,"bool ImGui::IsKeyDown(int)");
      }
      if ((pIVar14->IO).KeysDown[(int)uVar49] == true) {
        (pIVar14->IO).NavInputs[0x14] = 1.0;
        pIVar14->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    if ((pIVar14->IO).KeyCtrl == true) {
      (pIVar14->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar14->IO).KeyShift == true) {
      (pIVar14->IO).NavInputs[0xf] = 1.0;
    }
    if ((pIVar14->IO).KeyAlt == true) {
      (pIVar14->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar1 = (pIVar14->IO).NavInputsDownDuration;
  pfVar37 = pfVar1;
  pfVar41 = (pIVar14->IO).NavInputsDownDurationPrev;
  for (lVar20 = 0x15; lVar20 != 0; lVar20 = lVar20 + -1) {
    *pfVar41 = *pfVar37;
    pfVar37 = pfVar37 + (ulong)bVar48 * -2 + 1;
    pfVar41 = pfVar41 + (ulong)bVar48 * -2 + 1;
  }
  lVar20 = 0;
  do {
    fVar65 = -1.0;
    if (0.0 < (pIVar14->IO).NavInputs[lVar20]) {
      fVar65 = 0.0;
      if (0.0 <= pfVar1[lVar20]) {
        fVar65 = pfVar1[lVar20] + (pIVar14->IO).DeltaTime;
      }
    }
    pfVar1[lVar20] = fVar65;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 0x15);
  IVar8 = pIVar14->NavInitResultId;
  if ((IVar8 != 0) &&
     ((pIVar14->NavDisableHighlight != true || (pIVar14->NavInitRequestFromMove == true)))) {
    if (pIVar14->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0xbe1,"void ImGui::NavUpdate()");
    }
    iVar35 = pIVar14->NavLayer;
    if (pIVar14->NavInitRequestFromMove == true) {
      SetNavID(IVar8,iVar35);
      IVar52 = (pIVar14->NavInitResultRectRel).Max;
      pIVar4 = &pIVar14->NavWindow->NavRectRel[iVar35].Min;
      *pIVar4 = (pIVar14->NavInitResultRectRel).Min;
      pIVar4[1] = IVar52;
      pIVar14->NavMousePosDirty = true;
      pIVar14->NavDisableHighlight = false;
      pIVar14->NavDisableMouseHover = true;
    }
    else {
      SetNavID(IVar8,iVar35);
    }
    IVar52 = (pIVar14->NavInitResultRectRel).Max;
    pIVar4 = &pIVar14->NavWindow->NavRectRel[pIVar14->NavLayer].Min;
    *pIVar4 = (pIVar14->NavInitResultRectRel).Min;
    pIVar4[1] = IVar52;
  }
  pIVar14->NavInitRequest = false;
  pIVar14->NavInitRequestFromMove = false;
  pIVar14->NavInitResultId = 0;
  pIVar14->NavJustMovedToId = 0;
  pIVar15 = GImGui;
  if (pIVar14->NavMoveRequest == true) {
    pIVar38 = &pIVar14->NavMoveResultOther;
    IVar8 = (pIVar14->NavMoveResultOther).ID;
    if ((pIVar14->NavMoveResultLocal).ID == 0) {
      pIVar26 = pIVar38;
      if (IVar8 != 0) goto LAB_0014b0f3;
    }
    else {
      pIVar26 = &pIVar14->NavMoveResultLocal;
      if (IVar8 == 0) {
        pIVar27 = pIVar14->NavWindow;
LAB_0014b116:
        pIVar31 = pIVar27;
        pIVar38 = pIVar26;
      }
      else {
LAB_0014b0f3:
        pIVar27 = pIVar14->NavWindow;
        pIVar31 = ((pIVar14->NavMoveResultOther).Window)->ParentWindow;
        if (pIVar31 != pIVar27) goto LAB_0014b116;
        fVar65 = (pIVar14->NavMoveResultLocal).DistBox;
        fVar58 = (pIVar14->NavMoveResultOther).DistBox;
        if ((fVar65 <= fVar58) &&
           (((pIVar27 = pIVar31, fVar58 != fVar65 || (NAN(fVar58) || NAN(fVar65))) ||
            (fVar65 = (pIVar14->NavMoveResultLocal).DistCenter,
            pfVar1 = &(pIVar14->NavMoveResultOther).DistCenter,
            fVar65 < *pfVar1 || fVar65 == *pfVar1)))) goto LAB_0014b116;
      }
      if ((pIVar31 == (ImGuiWindow *)0x0) ||
         (pIVar27 = pIVar38->Window, pIVar27 == (ImGuiWindow *)0x0)) {
        __assert_fail("g.NavWindow && result->Window",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                      ,0xbf6,"void ImGui::NavUpdate()");
      }
      iVar35 = pIVar14->NavLayer;
      if ((long)iVar35 == 0) {
        IVar7 = pIVar38->RectRel;
        fVar68 = IVar7.Min.x;
        fVar70 = IVar7.Min.y;
        fVar71 = IVar7.Max.x;
        fVar72 = IVar7.Max.y;
        fVar51 = (pIVar27->Pos).x;
        fVar59 = (pIVar27->Pos).y;
        fVar65 = ((pIVar27->InnerRect).Min.x - fVar51) + -1.0;
        fVar58 = ((pIVar27->InnerRect).Min.y - fVar59) + -1.0;
        fVar51 = ((pIVar27->InnerRect).Max.x - fVar51) + 1.0;
        fVar59 = ((pIVar27->InnerRect).Max.y - fVar59) + 1.0;
        auVar75._4_4_ = -(uint)(fVar58 <= fVar70);
        auVar75._0_4_ = -(uint)(fVar65 <= fVar68);
        auVar75._8_4_ = -(uint)(fVar71 <= fVar51);
        auVar75._12_4_ = -(uint)(fVar72 <= fVar59);
        iVar19 = movmskps((int)pIVar26,auVar75);
        if (iVar19 != 0xf) {
          if (pIVar27->ScrollbarX == true) {
            if (fVar65 <= fVar68) {
              if (fVar71 < fVar51) goto LAB_0014b235;
              fVar65 = fVar71 + (pIVar27->Scroll).x + (GImGui->Style).ItemSpacing.x;
              fVar51 = 1.0;
            }
            else {
              fVar65 = ((pIVar27->Scroll).x + fVar68) - (GImGui->Style).ItemSpacing.x;
              fVar51 = 0.0;
            }
            (pIVar27->ScrollTarget).x = fVar65;
            (pIVar27->ScrollTargetCenterRatio).x = fVar51;
          }
LAB_0014b235:
          if (fVar58 <= fVar70) {
            fVar65 = (pIVar27->Scroll).y;
            if (fVar59 <= fVar72) {
              fVar51 = fVar72 + fVar65 + (pIVar15->Style).ItemSpacing.y;
              fVar58 = 1.0;
              goto LAB_0014b29c;
            }
          }
          else {
            fVar65 = (pIVar27->Scroll).y;
            fVar51 = (fVar70 + fVar65) - (pIVar15->Style).ItemSpacing.y;
            fVar58 = 0.0;
LAB_0014b29c:
            (pIVar27->ScrollTarget).y = fVar51;
            (pIVar27->ScrollTargetCenterRatio).y = fVar58;
          }
          IVar52 = CalcNextScrollFromScrollTargetAndClamp(pIVar27);
          fVar58 = (pIVar27->Scroll).x;
          (pIVar38->RectRel).Min.x = fVar68 + (fVar58 - IVar52.x);
          (pIVar38->RectRel).Min.y = fVar70 + (fVar65 - IVar52.y);
          (pIVar38->RectRel).Max.x = fVar71 + (fVar58 - IVar52.x);
          (pIVar38->RectRel).Max.y = fVar72 + (fVar65 - IVar52.y);
        }
      }
      bVar47 = pIVar15->ActiveId != 0;
      pIVar15->ActiveIdIsJustActivated = bVar47;
      if (bVar47) {
        pIVar15->ActiveIdTimer = 0.0;
      }
      pIVar15->ActiveId = 0;
      pIVar15->ActiveIdAllowNavDirFlags = 0;
      pIVar15->ActiveIdAllowOverlap = false;
      pIVar15->ActiveIdWindow = (ImGuiWindow *)0x0;
      pIVar14->NavWindow = pIVar27;
      SetNavID(pIVar38->ID,iVar35);
      IVar52 = (pIVar38->RectRel).Max;
      pIVar4 = &pIVar15->NavWindow->NavRectRel[iVar35].Min;
      *pIVar4 = (pIVar38->RectRel).Min;
      pIVar4[1] = IVar52;
      pIVar15->NavMousePosDirty = true;
      pIVar15->NavDisableHighlight = false;
      pIVar15->NavDisableMouseHover = true;
      pIVar14->NavJustMovedToId = pIVar38->ID;
      pIVar14->NavMoveFromClampedRefRect = false;
    }
  }
  if (pIVar14->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar14->NavMoveRequest == false) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0xc07,"void ImGui::NavUpdate()");
    }
    if (((pIVar14->NavMoveResultLocal).ID == 0) && ((pIVar14->NavMoveResultOther).ID == 0)) {
      pIVar14->NavDisableHighlight = false;
    }
    pIVar14->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar14->NavMousePosDirty == true) && (pIVar14->NavIdIsAlive == true)) {
    if ((((pIVar14->IO).ConfigFlags & 4) != 0) && (((pIVar14->IO).BackendFlags & 4) != 0)) {
      if ((pIVar14->NavDisableHighlight != false) || (pIVar14->NavDisableMouseHover == false)) {
        __assert_fail("!g.NavDisableHighlight && g.NavDisableMouseHover",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                      ,0xc13,"void ImGui::NavUpdate()");
      }
      IVar52 = NavCalcPreferredRefPos();
      (pIVar14->IO).MousePosPrev = IVar52;
      (pIVar14->IO).MousePos = IVar52;
      (pIVar14->IO).WantSetMousePos = true;
    }
    pIVar14->NavMousePosDirty = false;
  }
  pIVar14->NavIdIsAlive = false;
  pIVar14->NavJustTabbedId = 0;
  uVar49 = pIVar14->NavLayer;
  if (1 < uVar49) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xc1b,"void ImGui::NavUpdate()");
  }
  pIVar27 = pIVar14->NavWindow;
  pIVar31 = pIVar27;
  if (pIVar27 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar31->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar31 != pIVar27) {
          pIVar31->NavLastChildNavWindow = pIVar27;
        }
        break;
      }
      ppIVar11 = &pIVar31->ParentWindow;
      pIVar31 = *ppIVar11;
    } while (*ppIVar11 != (ImGuiWindow *)0x0);
    if ((uVar49 == 0) && (pIVar27->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar27->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar15 = GImGui;
  if (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0) {
    fVar65 = (GImGui->IO).NavInputsDownDuration[3];
    if ((((GImGui->IO).KeyCtrl == true) && (iVar35 = (GImGui->IO).KeyMap[0], -1 < iVar35)) &&
       (bVar47 = IsKeyPressed(iVar35,true), bVar47)) {
      bVar48 = (byte)(pIVar15->IO).ConfigFlags;
      uVar49 = (uint)bVar48;
      if (fVar65 == 0.0 || (bVar48 & 1) != 0) {
LAB_0014b517:
        pIVar27 = pIVar15->NavWindow;
        if ((pIVar27 != (ImGuiWindow *)0x0) ||
           (pIVar27 = FindWindowNavigable((pIVar15->Windows).Size + -1,-0x7fffffff,-1),
           pIVar27 != (ImGuiWindow *)0x0)) {
          pIVar15->NavWindowingTarget = pIVar27->RootWindowForTabbing;
          pIVar15->NavWindowingHighlightTimer = 0.0;
          pIVar15->NavWindowingHighlightAlpha = 0.0;
          pIVar15->NavWindowingToggleLayer = (bool)(~(byte)uVar49 & 1);
          pIVar15->NavInputSource = ImGuiInputSource_NavGamepad - (uVar49 & 1);
        }
      }
    }
    else if ((fVar65 == 0.0) && (!NAN(fVar65))) {
      uVar49 = 0;
      goto LAB_0014b517;
    }
    fVar65 = (pIVar15->IO).DeltaTime + pIVar15->NavWindowingHighlightTimer;
    pIVar15->NavWindowingHighlightTimer = fVar65;
    if (pIVar15->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_0014b59f;
LAB_0014b722:
    bVar47 = false;
    pIVar27 = (ImGuiWindow *)0x0;
  }
  else {
    fVar65 = (GImGui->IO).DeltaTime + GImGui->NavWindowingHighlightTimer;
    GImGui->NavWindowingHighlightTimer = fVar65;
LAB_0014b59f:
    IVar18 = pIVar15->NavInputSource;
    if (IVar18 != ImGuiInputSource_NavGamepad) {
LAB_0014b68b:
      if (IVar18 == ImGuiInputSource_NavKeyboard) {
        fVar58 = (pIVar15->NavWindowingHighlightTimer + -0.15) / 0.04;
        fVar65 = 1.0;
        if (fVar58 <= 1.0) {
          fVar65 = fVar58;
        }
        fVar65 = (float)(~-(uint)(fVar58 < 0.0) & (uint)fVar65);
        uVar49 = -(uint)(fVar65 <= pIVar15->NavWindowingHighlightAlpha);
        pIVar15->NavWindowingHighlightAlpha =
             (float)(uVar49 & (uint)pIVar15->NavWindowingHighlightAlpha | ~uVar49 & (uint)fVar65);
        iVar35 = (GImGui->IO).KeyMap[0];
        if ((-1 < iVar35) && (bVar47 = IsKeyPressed(iVar35,true), bVar47)) {
          NavUpdateWindowingHighlightWindow((pIVar15->IO).KeyShift - 1 | 1);
        }
        if ((pIVar15->IO).KeyCtrl == false) {
          pIVar27 = pIVar15->NavWindowingTarget;
          bVar47 = false;
          goto LAB_0014b76d;
        }
      }
      goto LAB_0014b722;
    }
    fVar58 = (fVar65 + -0.2) / 0.05;
    fVar65 = 1.0;
    if (fVar58 <= 1.0) {
      fVar65 = fVar58;
    }
    fVar65 = (float)(~-(uint)(fVar58 < 0.0) & (uint)fVar65);
    uVar49 = -(uint)(fVar65 <= pIVar15->NavWindowingHighlightAlpha);
    fVar51 = (float)(uVar49 & (uint)pIVar15->NavWindowingHighlightAlpha | ~uVar49 & (uint)fVar65);
    pIVar15->NavWindowingHighlightAlpha = fVar51;
    fVar65 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
    fVar58 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
    iVar35 = (uint)(0.0 < fVar65) - (uint)(0.0 < fVar58);
    if (iVar35 != 0) {
      NavUpdateWindowingHighlightWindow(iVar35);
      pIVar15->NavWindowingHighlightAlpha = 1.0;
      fVar51 = 1.0;
    }
    if (0.0 < (GImGui->IO).NavInputs[3]) {
      if (pIVar15->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_0014b722;
      IVar18 = pIVar15->NavInputSource;
      goto LAB_0014b68b;
    }
    pbVar2 = &pIVar15->NavWindowingToggleLayer;
    *pbVar2 = (bool)(*pbVar2 & fVar51 < 1.0);
    if (*pbVar2 == false) {
      pIVar27 = pIVar15->NavWindowingTarget;
      bVar47 = false;
    }
    else {
      bVar47 = pIVar15->NavWindow != (ImGuiWindow *)0x0;
      pIVar27 = (ImGuiWindow *)0x0;
    }
    pIVar15->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
LAB_0014b76d:
  if ((((pIVar15->ActiveId == 0) || (pIVar15->ActiveIdAllowOverlap == true)) &&
      (pfVar1 = (GImGui->IO).NavInputsDownDuration + 0x10, *pfVar1 <= 0.0 && *pfVar1 != 0.0)) &&
     (0.0 <= (GImGui->IO).NavInputsDownDurationPrev[0x10])) {
    if (-256000.0 <= (pIVar15->IO).MousePos.x) {
      bVar17 = -256000.0 <= (pIVar15->IO).MousePos.y;
    }
    else {
      bVar17 = false;
    }
    if (-256000.0 <= (pIVar15->IO).MousePosPrev.x) {
      bVar28 = -256000.0 <= (pIVar15->IO).MousePosPrev.y;
    }
    else {
      bVar28 = false;
    }
    bVar47 = (bool)(bVar47 | bVar17 ^ bVar28 ^ 1U);
  }
  pIVar31 = pIVar15->NavWindowingTarget;
  if ((pIVar31 != (ImGuiWindow *)0x0) && (uVar49 = pIVar31->Flags, (uVar49 & 4) == 0)) {
    IVar18 = pIVar15->NavInputSource;
    if ((IVar18 == ImGuiInputSource_NavGamepad) ||
       ((IVar52.x = 0.0, IVar52.y = 0.0, IVar18 == ImGuiInputSource_NavKeyboard &&
        (IVar18 = ImGuiInputSource_Mouse, (pIVar15->IO).KeyShift == false)))) {
      IVar52 = GetNavInputAmount2d(IVar18,ImGuiInputReadMode_Down,0.0,0.0);
    }
    fVar65 = IVar52.y;
    if (((IVar52.x != 0.0) || (fVar65 != 0.0)) || (NAN(fVar65))) {
      fVar58 = (pIVar15->IO).DisplayFramebufferScale.x;
      fVar51 = (pIVar15->IO).DisplayFramebufferScale.y;
      if (fVar51 <= fVar58) {
        fVar58 = fVar51;
      }
      fVar58 = (float)(int)(fVar58 * (pIVar15->IO).DeltaTime * 800.0);
      IVar60.x = (pIVar31->Pos).x + IVar52.x * fVar58;
      IVar60.y = (pIVar31->Pos).y + fVar65 * fVar58;
      pIVar31->Pos = IVar60;
      pIVar15->NavDisableMouseHover = true;
      if (((uVar49 >> 8 & 1) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
        GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
      }
    }
  }
  if (pIVar27 != (ImGuiWindow *)0x0) {
    if ((pIVar15->NavWindow == (ImGuiWindow *)0x0) ||
       (pIVar27 != pIVar15->NavWindow->RootWindowForTabbing)) {
      pIVar15->NavDisableHighlight = false;
      pIVar15->NavDisableMouseHover = true;
      pIVar31 = pIVar27->NavLastChildNavWindow;
      if (pIVar27->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
        pIVar31 = pIVar27;
      }
      ClosePopupsOverWindow(pIVar31);
      FocusWindow(pIVar31);
      if (pIVar31->NavLastIds[0] == 0) {
        NavInitWindow(pIVar31,false);
      }
      if ((pIVar31->DC).NavLayerActiveMask == 2) {
        pIVar15->NavLayer = 1;
      }
    }
    pIVar15->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar47) && (pIVar27 = pIVar15->NavWindow, pIVar27 != (ImGuiWindow *)0x0)) {
    pIVar31 = pIVar27;
    if (((pIVar27->DC).NavLayerActiveMask & 2) == 0) {
      do {
        if ((pIVar31->Flags & 0x15000000U) != 0x1000000) break;
        pIVar31 = pIVar31->ParentWindow;
      } while (((pIVar31->DC).NavLayerActiveMask & 2) == 0);
      if (pIVar31 == pIVar27) {
        pIVar15->NavDisableHighlight = false;
        pIVar15->NavDisableMouseHover = true;
        uVar49 = 0;
      }
      else {
        FocusWindow(pIVar31);
        pIVar31->NavLastChildNavWindow = pIVar27;
        uVar49 = 0;
        iVar35 = (pIVar15->NavWindow->DC).NavLayerActiveMask;
        pIVar15->NavDisableHighlight = false;
        pIVar15->NavDisableMouseHover = true;
        if ((iVar35 & 2) != 0) goto LAB_0014b9d1;
      }
    }
    else {
      pIVar15->NavDisableHighlight = false;
      pIVar15->NavDisableMouseHover = true;
LAB_0014b9d1:
      uVar49 = pIVar15->NavLayer ^ 1;
    }
    NavRestoreLayer(uVar49);
  }
  uVar49 = (pIVar14->IO).ConfigFlags;
  if ((uVar49 & 2) == 0) {
    bVar48 = 0;
  }
  else {
    bVar48 = (byte)(pIVar14->IO).BackendFlags & 1;
  }
  if ((((uVar49 & 1) == 0) && (bVar48 == 0)) || (pIVar14->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar14->IO).NavActive = false;
LAB_0014ba4d:
    bVar47 = true;
    if (pIVar14->NavWindowingTarget == (ImGuiWindow *)0x0) {
      bVar47 = pIVar14->NavInitRequest;
    }
  }
  else {
    bVar47 = (pIVar14->NavWindow->Flags & 0x40000U) == 0;
    (pIVar14->IO).NavActive = bVar47;
    if (((!bVar47) || (pIVar14->NavId == 0)) ||
       (bVar47 = true, pIVar14->NavDisableHighlight != false)) goto LAB_0014ba4d;
  }
  (pIVar14->IO).NavVisible = bVar47;
  pIVar15 = GImGui;
  fVar65 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar65 == 0.0) && (!NAN(fVar65))) {
    if (pIVar14->ActiveId == 0) {
      pIVar27 = pIVar14->NavWindow;
      if (((pIVar27 == (ImGuiWindow *)0x0) || ((pIVar27->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar27->ParentWindow == (ImGuiWindow *)0x0)) {
        iVar35 = (pIVar14->OpenPopupStack).Size;
        if ((long)iVar35 < 1) {
          if (pIVar14->NavLayer == 0) {
            if ((pIVar27 != (ImGuiWindow *)0x0) && ((pIVar27->Flags & 0x5000000U) != 0x1000000)) {
              pIVar27->NavLastIds[0] = 0;
            }
            pIVar14->NavId = 0;
          }
          else {
            NavRestoreLayer(0);
          }
        }
        else if ((((pIVar14->OpenPopupStack).Data[(long)iVar35 + -1].Window)->Flags & 0x8000000) ==
                 0) {
          ClosePopupToLevel(iVar35 + -1);
        }
      }
      else {
        if (pIVar27->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                        ,0xc37,"void ImGui::NavUpdate()");
        }
        FocusWindow(pIVar27->ParentWindow);
        ppIVar11 = &GImGui->NavWindow;
        if (*ppIVar11 == (ImGuiWindow *)0x0) {
          __assert_fail("g.NavWindow",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                        ,0x7f7,"void SetNavID(ImGuiID, int)");
        }
        IVar8 = pIVar27->ChildId;
        GImGui->NavId = IVar8;
        (*ppIVar11)->NavLastIds[0] = IVar8;
        pIVar14->NavIdIsAlive = false;
        if (pIVar14->NavDisableMouseHover == true) {
          pIVar14->NavMousePosDirty = true;
        }
      }
    }
    else {
      bVar47 = GImGui->ActiveId != 0;
      GImGui->ActiveIdIsJustActivated = bVar47;
      if (bVar47) {
        pIVar15->ActiveIdTimer = 0.0;
      }
      pIVar15->ActiveId = 0;
      pIVar15->ActiveIdAllowNavDirFlags = 0;
      pIVar15->ActiveIdAllowOverlap = false;
      pIVar15->ActiveIdWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar14->NavActivateId = 0;
  pIVar14->NavActivateDownId = 0;
  pIVar14->NavActivatePressedId = 0;
  pIVar15 = GImGui;
  pIVar14->NavInputId = 0;
  IVar8 = pIVar14->NavId;
  IVar29 = 0;
  if ((IVar8 == 0) || (pIVar14->NavDisableHighlight != false)) {
    IVar32 = 0;
LAB_0014bb09:
    pIVar27 = pIVar14->NavWindow;
    bVar47 = pIVar27 == (ImGuiWindow *)0x0;
    if ((!bVar47) && ((pIVar27->Flags & 0x40000) != 0)) {
      pIVar14->NavDisableHighlight = true;
    }
    if (IVar29 != IVar32 && IVar32 != 0) {
      __assert_fail("g.NavActivateDownId == g.NavActivateId",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0xc64,"void ImGui::NavUpdate()");
    }
  }
  else {
    IVar32 = 0;
    if (pIVar14->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_0014bb09;
    IVar29 = 0;
    if (pIVar14->NavWindow != (ImGuiWindow *)0x0) {
      if ((pIVar14->NavWindow->Flags & 0x40000) == 0) {
        if (0.0 < (GImGui->IO).NavInputs[0]) {
          fVar65 = (GImGui->IO).NavInputsDownDuration[0];
          IVar16 = IVar8;
          if (0.0 <= fVar65) {
            IVar36 = pIVar14->ActiveId;
            if (IVar36 == 0 && fVar65 == 0.0) {
              pIVar14->NavActivateId = IVar8;
              pIVar14->NavActivateDownId = IVar8;
              IVar32 = IVar8;
            }
            else {
              if (IVar36 == 0) {
                pIVar14->NavActivateDownId = IVar8;
              }
              else {
                if (IVar36 != IVar8) goto LAB_0014bdfb;
                pIVar14->NavActivateDownId = IVar8;
              }
              IVar32 = 0;
              if ((fVar65 != 0.0) || (IVar32 = 0, NAN(fVar65))) goto LAB_0014cdb6;
            }
            pIVar14->NavActivatePressedId = IVar8;
          }
          else {
            IVar36 = pIVar14->ActiveId;
            if ((IVar36 != 0) && (IVar36 != IVar8)) goto LAB_0014bdfb;
            pIVar14->NavActivateDownId = IVar8;
            IVar32 = 0;
          }
        }
        else {
          IVar36 = pIVar14->ActiveId;
          if (IVar36 == 0) {
            IVar32 = 0;
            IVar16 = 0;
          }
          else {
LAB_0014bdfb:
            IVar29 = 0;
            IVar32 = 0;
            IVar16 = 0;
            if (IVar36 != IVar8) goto LAB_0014bb09;
          }
        }
LAB_0014cdb6:
        IVar29 = IVar16;
        fVar65 = (pIVar15->IO).NavInputsDownDuration[2];
        if ((fVar65 == 0.0) && (!NAN(fVar65))) {
          pIVar14->NavInputId = IVar8;
        }
      }
      goto LAB_0014bb09;
    }
    bVar47 = true;
    pIVar27 = (ImGuiWindow *)0x0;
  }
  pIVar14->NavMoveRequest = false;
  IVar29 = pIVar14->NavNextActivateId;
  if (IVar29 != 0) {
    pIVar14->NavActivateId = IVar29;
    pIVar14->NavActivateDownId = IVar29;
    pIVar14->NavActivatePressedId = IVar29;
    pIVar14->NavInputId = IVar29;
  }
  pIVar14->NavNextActivateId = 0;
  if (pIVar14->ActiveId == 0) {
    uVar49 = 0xffffffff;
  }
  else {
    uVar49 = pIVar14->ActiveIdAllowNavDirFlags;
  }
  if (pIVar14->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar14->NavMoveDir = -1;
    uVar50 = 0xffffffff;
    bVar48 = 0;
    if (((!bVar47) && (bVar48 = 0, uVar49 != 0 && pIVar14->NavWindowingTarget == (ImGuiWindow *)0x0)
        ) && (bVar48 = 0, (pIVar27->Flags & 0x40000) == 0)) {
      if ((uVar49 & 1) != 0) {
        fVar65 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat);
        fVar58 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar58 + fVar65) {
          pIVar14->NavMoveDir = 0;
          uVar50 = 0;
        }
      }
      if ((uVar49 & 2) != 0) {
        fVar65 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat);
        fVar58 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar58 + fVar65) {
          pIVar14->NavMoveDir = 1;
          uVar50 = 1;
        }
      }
      if ((uVar49 & 4) != 0) {
        fVar65 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat);
        fVar58 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar58 + fVar65) {
          pIVar14->NavMoveDir = 2;
          uVar50 = 2;
        }
      }
      if ((uVar49 & 8) != 0) {
        bVar47 = false;
        fVar65 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat);
        fVar58 = GetNavInputAmount(0x14,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar58 + fVar65) {
          pIVar14->NavMoveDir = 3;
          uVar50 = 3;
          goto LAB_0014bbbe;
        }
      }
      if (uVar50 != 0xffffffff) goto LAB_0014bbbe;
      uVar50 = 0xffffffff;
      bVar48 = 0;
    }
  }
  else {
    uVar50 = pIVar14->NavMoveDir;
    if (uVar50 == 0xffffffff) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0xc7c,"void ImGui::NavUpdate()");
    }
    if (pIVar14->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0xc7d,"void ImGui::NavUpdate()");
    }
    pIVar14->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
LAB_0014bbbe:
    pIVar14->NavMoveRequest = true;
    pIVar14->NavMoveDirLast = uVar50;
    bVar48 = 1;
    if (IVar8 == 0) {
      pIVar14->NavInitRequest = true;
      pIVar14->NavInitRequestFromMove = true;
      pIVar14->NavInitResultId = 0;
      pIVar14->NavDisableHighlight = false;
      bVar48 = 1;
    }
  }
  pIVar15 = GImGui;
  if (GImGui->NavMoveRequest == false) {
    pbVar2 = &GImGui->NavInitRequest;
    GImGui->NavAnyRequest = *pbVar2;
    if (*pbVar2 != false) goto LAB_0014bf41;
  }
  else {
    GImGui->NavAnyRequest = true;
LAB_0014bf41:
    if (pIVar15->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0x935,"void NavUpdateAnyRequestFlag()");
    }
  }
  if (((!bVar47) && ((pIVar27->Flags & 0x40000) == 0)) &&
     (pIVar14->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar65 = (float)(int)(pIVar15->FontBaseSize * pIVar27->FontWindowScale * 100.0 *
                          (pIVar14->IO).DeltaTime + 0.5);
    if (((pIVar27->DC).NavLayerActiveMask == 0) && ((bVar48 & (pIVar27->DC).NavHasScroll) == 1)) {
      if (uVar50 < 2) {
        fVar58 = (pIVar27->Scroll).x;
        fVar51 = (pIVar27->DC).CursorMaxPos.x;
        fVar59 = (float)(int)(*(float *)(&DAT_001a8a38 + (ulong)(uVar50 == 0) * 4) * fVar65 + fVar58
                             );
        (pIVar27->Scroll).x = fVar59;
        (pIVar27->DC).CursorMaxPos.x = (fVar58 + fVar51) - fVar59;
      }
      else if ((uVar50 & 0xfffffffe) == 2) {
        fVar58 = (pIVar27->Scroll).y;
        fVar51 = (pIVar27->DC).CursorMaxPos.y;
        fVar59 = (float)(int)(*(float *)(&DAT_001a8a38 + (ulong)(uVar50 == 2) * 4) * fVar65 + fVar58
                             );
        (pIVar27->Scroll).y = fVar59;
        (pIVar27->DC).CursorMaxPos.y = (fVar58 + fVar51) - fVar59;
      }
    }
    IVar52 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar58 = IVar52.x;
    fVar51 = IVar52.y;
    if (((fVar58 != 0.0) || (NAN(fVar58))) && (pIVar27->ScrollbarX == true)) {
      fVar59 = (pIVar27->Scroll).x;
      fVar68 = (float)(int)(fVar58 * fVar65 + fVar59);
      fVar58 = (pIVar27->DC).CursorMaxPos.x;
      (pIVar27->Scroll).x = fVar68;
      (pIVar27->DC).CursorMaxPos.x = (fVar59 + fVar58) - fVar68;
      pIVar14->NavMoveFromClampedRefRect = true;
    }
    if ((fVar51 != 0.0) || (NAN(fVar51))) {
      fVar58 = (pIVar27->Scroll).y;
      fVar51 = (float)(int)(fVar51 * fVar65 + fVar58);
      fVar65 = (pIVar27->DC).CursorMaxPos.y;
      (pIVar27->Scroll).y = fVar51;
      (pIVar27->DC).CursorMaxPos.y = (fVar58 + fVar65) - fVar51;
      pIVar14->NavMoveFromClampedRefRect = true;
    }
  }
  (pIVar14->NavMoveResultLocal).ID = 0;
  (pIVar14->NavMoveResultLocal).ParentID = 0;
  (pIVar14->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar14->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar14->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar14->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar14->NavMoveResultLocal).RectRel.Min.x = 3.4028235e+38;
  *(undefined8 *)&(pIVar14->NavMoveResultLocal).RectRel.Min.y = 0xff7fffff7f7fffff;
  (pIVar14->NavMoveResultLocal).RectRel.Max.y = -3.4028235e+38;
  (pIVar14->NavMoveResultOther).ID = 0;
  (pIVar14->NavMoveResultOther).ParentID = 0;
  (pIVar14->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar14->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar14->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (pIVar14->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar14->NavMoveResultOther).RectRel.Min.x = 3.4028235e+38;
  *(undefined8 *)&(pIVar14->NavMoveResultOther).RectRel.Min.y = 0xff7fffff7f7fffff;
  (pIVar14->NavMoveResultOther).RectRel.Max.y = -3.4028235e+38;
  if (((bVar48 != 0) && (pIVar14->NavMoveFromClampedRefRect == true)) && (pIVar14->NavLayer == 0)) {
    IVar52 = (pIVar27->InnerRect).Min;
    fVar65 = (pIVar27->Pos).x;
    fVar51 = (pIVar27->Pos).y;
    fVar59 = (IVar52.x - fVar65) + -1.0;
    fVar68 = (IVar52.y - fVar51) + -1.0;
    IVar52 = (pIVar27->InnerRect).Max;
    fVar58 = (IVar52.x - fVar65) + 1.0;
    fVar51 = (IVar52.y - fVar51) + 1.0;
    IVar52 = pIVar27->NavRectRel[0].Min;
    fVar70 = IVar52.x;
    fVar65 = pIVar27->NavRectRel[0].Max.x;
    fVar71 = IVar52.y;
    if ((((fVar70 < fVar59) || (fVar71 < fVar68)) || (fVar58 < fVar65)) ||
       (fVar51 < pIVar27->NavRectRel[0].Max.y)) {
      auVar73._0_4_ = pIVar15->FontBaseSize * pIVar27->FontWindowScale * 0.5;
      auVar74._0_4_ = fVar58 - fVar59;
      auVar74._4_4_ = fVar51 - fVar68;
      auVar74._8_8_ = 0;
      auVar73._4_4_ = auVar73._0_4_;
      auVar73._8_4_ = auVar73._0_4_;
      auVar73._12_4_ = auVar73._0_4_;
      auVar75 = minps(auVar74,auVar73);
      fVar59 = fVar59 + auVar75._0_4_;
      fVar68 = fVar68 + auVar75._4_4_;
      uVar49 = -(uint)(fVar59 <= fVar70);
      uVar50 = -(uint)(fVar68 <= fVar71);
      pIVar27->NavRectRel[0].Min =
           (ImVec2)(CONCAT44(~uVar50 & (uint)fVar68,~uVar49 & (uint)fVar59) |
                   CONCAT44((uint)fVar71 & uVar50,(uint)fVar70 & uVar49));
      auVar56._0_4_ = fVar58 - auVar75._0_4_;
      auVar56._4_4_ = fVar51 - auVar75._4_4_;
      auVar56._8_4_ = 0.0 - auVar75._8_4_;
      auVar56._12_4_ = 0.0 - auVar75._12_4_;
      auVar67._4_4_ = pIVar27->NavRectRel[0].Max.y;
      auVar67._0_4_ = fVar65;
      auVar67._8_8_ = 0;
      auVar75 = minps(auVar67,auVar56);
      pIVar27->NavRectRel[0].Max = auVar75._0_8_;
      pIVar14->NavId = 0;
      pIVar27 = pIVar14->NavWindow;
    }
    pIVar14->NavMoveFromClampedRefRect = false;
  }
  if (pIVar27 == (ImGuiWindow *)0x0) {
    fVar65 = (pIVar15->IO).DisplayVisibleMin.x;
    pIVar4 = &(pIVar15->IO).DisplayVisibleMax;
    if ((fVar65 != pIVar4->x) || (NAN(fVar65) || NAN(pIVar4->x))) {
      fVar65 = (pIVar15->IO).DisplayVisibleMin.y;
      pfVar1 = &(pIVar15->IO).DisplayVisibleMax.y;
      if ((fVar65 != *pfVar1) || (NAN(fVar65) || NAN(*pfVar1))) {
        IVar62 = (pIVar15->IO).DisplayVisibleMin;
        IVar54 = (pIVar15->IO).DisplayVisibleMax;
        goto LAB_0014c380;
      }
    }
    IVar54 = (pIVar15->IO).DisplaySize;
    IVar62.x = 0.0;
    IVar62.y = 0.0;
  }
  else {
    IVar52 = pIVar27->NavRectRel[pIVar14->NavLayer].Min;
    IVar60 = pIVar27->NavRectRel[pIVar14->NavLayer].Max;
    IVar53.x = 0.0;
    IVar53.y = 0.0;
    IVar61.x = 0.0;
    IVar61.y = 0.0;
    if (IVar52.y <= IVar60.y && IVar52.x <= IVar60.x) {
      IVar53 = IVar60;
      IVar61 = IVar52;
    }
    fVar65 = (pIVar27->Pos).x;
    IVar62.x = IVar61.x + fVar65;
    fVar58 = (pIVar27->Pos).y;
    IVar62.y = IVar61.y + fVar58;
    IVar54.x = IVar53.x + fVar65;
    IVar54.y = IVar53.y + fVar58;
  }
LAB_0014c380:
  (pIVar14->NavScoringRectScreen).Min = IVar62;
  (pIVar14->NavScoringRectScreen).Max = IVar54;
  fVar65 = IVar62.x + 1.0;
  if (IVar54.x <= fVar65) {
    fVar65 = IVar54.x;
  }
  (pIVar14->NavScoringRectScreen).Min.x = fVar65;
  (pIVar14->NavScoringRectScreen).Max.x = fVar65;
  if (IVar54.y < IVar62.y) {
    __assert_fail("!g.NavScoringRectScreen.IsInverted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xcc6,"void ImGui::NavUpdate()");
  }
  pIVar14->NavScoringCount = 0;
  fVar65 = (pIVar15->IO).MousePos.x;
  if (((fVar65 < -256000.0) || (fVar58 = (pIVar15->IO).MousePos.y, fVar58 < -256000.0)) ||
     ((fVar51 = (pIVar15->IO).MousePosPrev.x, fVar51 < -256000.0 ||
      (fVar59 = (pIVar15->IO).MousePosPrev.y, fVar59 < -256000.0)))) {
    (pIVar15->IO).MouseDelta.x = 0.0;
    (pIVar15->IO).MouseDelta.y = 0.0;
  }
  else {
    fVar65 = fVar65 - fVar51;
    fVar58 = fVar58 - fVar59;
    IVar66.y = fVar58;
    IVar66.x = fVar65;
    (pIVar15->IO).MouseDelta = IVar66;
    if (((fVar65 != 0.0) || (fVar58 != 0.0)) || (NAN(fVar58))) {
      pIVar15->NavDisableMouseHover = false;
    }
  }
  IVar52 = (pIVar15->IO).MousePos;
  (pIVar15->IO).MousePosPrev = IVar52;
  lVar20 = 0x40a;
  do {
    if (*(char *)((long)pIVar15 + lVar20 + -0x2fa) == '\x01') {
      fVar65 = *(float *)((long)pIVar15 + lVar20 * 4 + -0xc14);
      *(bool *)((long)(pIVar15->IO).KeyMap + lVar20 + -0x46) = fVar65 < 0.0;
      *(undefined1 *)((long)(pIVar15->IO).KeyMap + lVar20 + -0x3c) = 0;
      *(float *)((long)pIVar15 + lVar20 * 4 + -0xc00) = fVar65;
      if (0.0 <= fVar65) {
        *(float *)((long)pIVar15 + lVar20 * 4 + -0xc14) = fVar65 + (pIVar15->IO).DeltaTime;
        *(undefined1 *)((long)(pIVar15->IO).KeyMap + lVar20 + -0x41) = 0;
        uVar5 = *(undefined8 *)((long)pIVar15 + lVar20 * 8 + -0x1c8c);
        uVar6 = *(undefined8 *)((long)pIVar15 + lVar20 * 8 + -0x1c14);
        auVar77._0_4_ = IVar52.x - (float)uVar5;
        auVar77._4_4_ = IVar52.y - (float)((ulong)uVar5 >> 0x20);
        auVar77._8_8_ = 0;
        uVar33 = CONCAT44(auVar77._4_4_,auVar77._0_4_);
        auVar76._0_8_ = uVar33 ^ 0x8000000080000000;
        auVar76._8_4_ = 0x80000000;
        auVar76._12_4_ = 0x80000000;
        auVar75 = maxps(auVar76,auVar77);
        fVar65 = (float)uVar6;
        fVar58 = (float)((ulong)uVar6 >> 0x20);
        uVar49 = -(uint)(auVar75._0_4_ <= fVar65);
        uVar50 = -(uint)(auVar75._4_4_ <= fVar58);
        *(ulong *)((long)pIVar15 + lVar20 * 8 + -0x1c14) =
             CONCAT44(~uVar50 & (uint)auVar75._4_4_,~uVar49 & (uint)auVar75._0_4_) |
             CONCAT44((uint)fVar58 & uVar50,(uint)fVar65 & uVar49);
        fVar65 = *(float *)((long)pIVar15 + lVar20 * 4 + -0xbc4);
        fVar58 = auVar77._0_4_ * auVar77._0_4_ + auVar77._4_4_ * auVar77._4_4_;
        uVar49 = -(uint)(fVar58 <= fVar65);
        *(uint *)((long)pIVar15 + lVar20 * 4 + -0xbc4) =
             uVar49 & (uint)fVar65 | ~uVar49 & (uint)fVar58;
      }
      else {
        *(undefined4 *)((long)pIVar15 + lVar20 * 4 + -0xc14) = 0;
        *(undefined1 *)((long)(pIVar15->IO).KeyMap + lVar20 + -0x41) = 0;
        fVar65 = pIVar15->Time;
        if ((fVar65 - *(float *)((long)pIVar15 + lVar20 * 4 + -0xc3c) <
             (pIVar15->IO).MouseDoubleClickTime) &&
           (fVar51 = IVar52.x - *(float *)((long)pIVar15 + lVar20 * 8 + -0x1c8c),
           fVar59 = IVar52.y - *(float *)((long)pIVar15 + lVar20 * 8 + -0x1c88),
           fVar58 = (pIVar15->IO).MouseDoubleClickMaxDist, fVar65 = -3.4028235e+38,
           fVar51 * fVar51 + fVar59 * fVar59 < fVar58 * fVar58)) {
          *(undefined1 *)((long)(pIVar15->IO).KeyMap + lVar20 + -0x41) = 1;
          fVar65 = -3.4028235e+38;
        }
        *(float *)((long)pIVar15 + lVar20 * 4 + -0xc3c) = fVar65;
        *(ImVec2 *)((long)pIVar15 + lVar20 * 8 + -0x1c8c) = IVar52;
        *(undefined8 *)((long)pIVar15 + lVar20 * 8 + -0x1c14) = 0;
        *(undefined4 *)((long)pIVar15 + lVar20 * 4 + -0xbc4) = 0;
        if ((*(byte *)((long)(pIVar15->IO).KeyMap + lVar20 + -0x46) & 1) != 0) {
          pIVar15->NavDisableMouseHover = false;
        }
      }
    }
    else {
      *(undefined1 *)((long)(pIVar15->IO).KeyMap + lVar20 + -0x46) = 0;
      fVar65 = *(float *)((long)pIVar15 + lVar20 * 4 + -0xc14);
      *(bool *)((long)(pIVar15->IO).KeyMap + lVar20 + -0x3c) = 0.0 <= fVar65;
      *(float *)((long)pIVar15 + lVar20 * 4 + -0xc00) = fVar65;
      *(undefined4 *)((long)pIVar15 + lVar20 * 4 + -0xc14) = 0xbf800000;
      *(undefined1 *)((long)(pIVar15->IO).KeyMap + lVar20 + -0x41) = 0;
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 0x40f);
  fVar65 = (pIVar13->IO).DeltaTime;
  iVar35 = pIVar13->FramerateSecPerFrameIdx;
  pIVar13->FramerateSecPerFrameAccum =
       (fVar65 - pIVar13->FramerateSecPerFrame[iVar35]) + pIVar13->FramerateSecPerFrameAccum;
  pIVar13->FramerateSecPerFrame[iVar35] = fVar65;
  iVar19 = iVar35 + (int)((ulong)((long)(iVar35 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar13->FramerateSecPerFrameIdx = iVar35 + 1 + ((iVar19 >> 6) - (iVar19 >> 0x1f)) * -0x78;
  uVar49 = -(uint)(0.0 < pIVar13->FramerateSecPerFrameAccum);
  (pIVar13->IO).Framerate =
       (float)(~uVar49 & 0x7f7fffff |
              (uint)(1.0 / (pIVar13->FramerateSecPerFrameAccum / 120.0)) & uVar49);
  pIVar14 = GImGui;
  pIVar27 = GImGui->MovingWindow;
  if (pIVar27 == (ImGuiWindow *)0x0) {
    if (((GImGui->ActiveIdWindow != (ImGuiWindow *)0x0) &&
        (IVar8 = GImGui->ActiveIdWindow->MoveId, IVar8 == GImGui->ActiveId)) &&
       (GImGui->ActiveIdIsAlive = true, (pIVar14->IO).MouseDown[0] == false)) {
      pIVar14->ActiveIdIsJustActivated = IVar8 != 0;
      if (IVar8 != 0) {
        pIVar14->ActiveIdTimer = 0.0;
      }
      pIVar14->ActiveId = 0;
      pIVar14->ActiveIdAllowNavDirFlags = 0;
      pIVar14->ActiveIdAllowOverlap = false;
      pIVar14->ActiveIdWindow = (ImGuiWindow *)0x0;
    }
  }
  else {
    pIVar3 = &GImGui->ActiveId;
    GImGui->ActiveIdIsAlive = true;
    pIVar31 = pIVar27->RootWindow;
    if (pIVar31 == (ImGuiWindow *)0x0) {
      __assert_fail("g.MovingWindow && g.MovingWindow->RootWindow",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0xcd7,"void ImGui::UpdateMovingWindow()");
    }
    if ((((pIVar14->IO).MouseDown[0] != true) ||
        (fVar65 = (pIVar14->IO).MousePos.x, fVar65 < -256000.0)) ||
       (fVar58 = (pIVar14->IO).MousePos.y, fVar58 < -256000.0)) {
      bVar47 = *pIVar3 != 0;
      pIVar14->ActiveIdIsJustActivated = bVar47;
      if (bVar47) {
        pIVar14->ActiveIdTimer = 0.0;
      }
      pIVar14->ActiveId = 0;
      pIVar14->ActiveIdAllowNavDirFlags = 0;
      pIVar14->ActiveIdAllowOverlap = false;
      pIVar14->ActiveIdWindow = (ImGuiWindow *)0x0;
      pIVar14->MovingWindow = (ImGuiWindow *)0x0;
    }
    else {
      local_38.x = fVar65 - (pIVar14->ActiveIdClickOffset).x;
      local_38.y = fVar58 - (pIVar14->ActiveIdClickOffset).y;
      fVar65 = (pIVar31->Pos).x;
      if ((fVar65 != local_38.x) || (NAN(fVar65) || NAN(local_38.x))) {
LAB_0014c80f:
        if (((pIVar31->Flags & 0x100) == 0) && (pIVar14->SettingsDirtyTimer <= 0.0)) {
          pIVar14->SettingsDirtyTimer = (pIVar14->IO).IniSavingRate;
        }
        ::SetWindowPos(pIVar31,&local_38,1);
        pIVar27 = pIVar14->MovingWindow;
      }
      else {
        fVar65 = (pIVar31->Pos).y;
        if ((fVar65 != local_38.y) || (NAN(fVar65) || NAN(local_38.y))) goto LAB_0014c80f;
      }
      FocusWindow(pIVar27);
    }
  }
  NewFrameUpdateHoveredWindowAndCaptureFlags();
  pIVar27 = GetFrontMostPopupModal();
  if (pIVar27 == (ImGuiWindow *)0x0) {
    fVar65 = 0.0;
  }
  else {
    fVar65 = (pIVar13->IO).DeltaTime * 6.0 + pIVar13->ModalWindowDarkeningRatio;
    if (1.0 <= fVar65) {
      fVar65 = 1.0;
    }
  }
  pIVar13->ModalWindowDarkeningRatio = fVar65;
  pIVar13->MouseCursor = 0;
  pIVar13->WantTextInputNextFrame = -1;
  pIVar13->WantCaptureMouseNextFrame = -1;
  pIVar13->WantCaptureKeyboardNextFrame = -1;
  (pIVar13->PlatformImePos).x = 1.0;
  (pIVar13->PlatformImePos).y = 1.0;
  pIVar27 = pIVar13->HoveredWindow;
  if (((pIVar27 != (ImGuiWindow *)0x0) && (pIVar27->Collapsed == false)) &&
     ((fVar65 = (pIVar13->IO).MouseWheel, pIVar31 = pIVar27, fVar65 != 0.0 ||
      ((fVar58 = (pIVar13->IO).MouseWheelH, fVar58 != 0.0 || (NAN(fVar58))))))) {
    do {
      pIVar40 = pIVar31;
      uVar49 = pIVar40->Flags;
      if ((uVar49 & 0x1000218) != 0x1000010) break;
      pIVar31 = pIVar40->ParentWindow;
    } while (pIVar40->ParentWindow != (ImGuiWindow *)0x0);
    if ((fVar65 != 0.0) || (NAN(fVar65))) {
      if ((pIVar13->IO).KeyCtrl == true) {
        if ((pIVar13->IO).FontAllowUserScaling == true) {
          fVar58 = fVar65 * 0.1 + pIVar27->FontWindowScale;
          fVar65 = 2.5;
          if (fVar58 <= 2.5) {
            fVar65 = fVar58;
          }
          fVar65 = (float)(-(uint)(fVar58 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar58 < 0.5) & (uint)fVar65);
          fVar51 = fVar65 / pIVar27->FontWindowScale;
          pIVar27->FontWindowScale = fVar65;
          fVar59 = 1.0 - fVar51;
          uVar78._0_4_ = (pIVar27->Pos).x;
          uVar78._4_4_ = (pIVar27->Pos).y;
          uVar79._0_4_ = (pIVar27->Size).x;
          uVar79._4_4_ = (pIVar27->Size).y;
          fVar65 = (float)((ulong)uVar78 >> 0x20);
          fVar58 = (float)((ulong)uVar79 >> 0x20);
          IVar52 = (pIVar13->IO).MousePos;
          auVar69._8_8_ = uVar79;
          auVar69._0_8_ = uVar79;
          auVar64._0_4_ =
               (IVar52.x - (float)(undefined4)uVar78) * fVar59 * (float)(undefined4)uVar79;
          auVar64._4_4_ = (IVar52.y - fVar65) * fVar59 * fVar58;
          auVar64._8_4_ = (0.0 - (float)(undefined4)uVar79) * fVar59 * (float)(undefined4)uVar79;
          auVar64._12_4_ = (0.0 - fVar58) * fVar59 * fVar58;
          auVar75 = divps(auVar64,auVar69);
          IVar63.x = auVar75._0_4_ + (float)(undefined4)uVar78;
          IVar63.y = auVar75._4_4_ + fVar65;
          auVar12._4_8_ = uVar79;
          auVar12._0_4_ = fVar65 * fVar51;
          auVar57._0_8_ = auVar12._0_8_ << 0x20;
          auVar57._8_4_ = (float)(undefined4)uVar79 * fVar51;
          auVar57._12_4_ = fVar58 * fVar51;
          pIVar27->Pos = IVar63;
          pIVar27->Size = auVar57._8_8_;
          IVar55.x = (pIVar27->SizeFull).x * fVar51;
          IVar55.y = (pIVar27->SizeFull).y * fVar51;
          pIVar27->SizeFull = IVar55;
        }
      }
      else {
        if ((uVar49 & 0x210) != 0) goto LAB_0014c8d3;
        fVar51 = GImGui->FontBaseSize * pIVar40->FontWindowScale * 5.0;
        fVar58 = (pIVar40->WindowPadding).y;
        fVar58 = (fVar58 + fVar58 +
                 ((pIVar40->ContentsRegionRect).Max.y - (pIVar40->ContentsRegionRect).Min.y)) * 0.67
        ;
        if (fVar58 <= fVar51) {
          fVar51 = fVar58;
        }
        fVar58 = (pIVar40->Scroll).y;
        fVar59 = (pIVar40->DC).CursorMaxPos.y;
        fVar65 = fVar58 - fVar65 * (float)(int)fVar51;
        (pIVar40->Scroll).y = fVar65;
        (pIVar40->DC).CursorMaxPos.y = (fVar58 + fVar59) - fVar65;
      }
    }
    if ((uVar49 & 0x210) == 0) {
      fVar65 = (pIVar13->IO).MouseWheelH;
      if ((((fVar65 != 0.0) || (NAN(fVar65))) && ((pIVar13->IO).KeyCtrl == false)) &&
         ((pIVar27->Flags & 0x10) == 0)) {
        fVar58 = (pIVar27->Scroll).x;
        fVar51 = (pIVar27->DC).CursorMaxPos.x;
        fVar65 = fVar58 - fVar65 * GImGui->FontBaseSize * pIVar40->FontWindowScale;
        (pIVar27->Scroll).x = fVar65;
        (pIVar27->DC).CursorMaxPos.x = (fVar58 + fVar51) - fVar65;
      }
    }
  }
LAB_0014c8d3:
  if (((((pIVar13->ActiveId == 0) && (pIVar27 = pIVar13->NavWindow, pIVar27 != (ImGuiWindow *)0x0))
       && ((pIVar27->Active == true &&
           (((pIVar27->Flags & 0x40000) == 0 && ((pIVar13->IO).KeyCtrl == false)))))) &&
      (iVar35 = (GImGui->IO).KeyMap[0], -1 < iVar35)) &&
     (bVar47 = IsKeyPressed(iVar35,false), bVar47)) {
    if ((pIVar13->NavId == 0) || (pIVar13->NavIdTabCounter == 0x7fffffff)) {
      iVar35 = -(uint)(pIVar13->IO).KeyShift;
    }
    else {
      iVar35 = pIVar13->NavIdTabCounter + (-(uint)(pIVar13->IO).KeyShift | 1) + 1;
    }
    pIVar13->NavWindow->FocusIdxTabRequestNext = iVar35;
  }
  pIVar13->NavIdTabCounter = 0x7fffffff;
  uVar49 = (pIVar13->Windows).Size;
  if ((ulong)uVar49 != 0) {
    uVar33 = 0;
    if (0 < (int)uVar49) {
      uVar33 = (ulong)uVar49;
    }
    uVar39 = 0;
    do {
      if (uVar33 == uVar39) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.h"
                      ,0x49a,
                      "value_type &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      pIVar27 = (pIVar13->Windows).Data[uVar39];
      pIVar27->WasActive = pIVar27->Active;
      pIVar27->Active = false;
      pIVar27->WriteAccessed = false;
      uVar39 = uVar39 + 1;
    } while (uVar49 != uVar39);
  }
  if ((pIVar13->NavWindow != (ImGuiWindow *)0x0) && (pIVar13->NavWindow->WasActive == false)) {
    FocusFrontMostActiveWindow((ImGuiWindow *)0x0);
  }
  if ((pIVar13->CurrentWindowStack).Capacity < 0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    ppIVar45 = (ImGuiWindow **)0x0;
    __dest = (ImGuiWindow **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    ppIVar11 = (pIVar13->CurrentWindowStack).Data;
    if (ppIVar11 != (ImGuiWindow **)0x0) {
      memcpy(__dest,ppIVar11,(long)(pIVar13->CurrentWindowStack).Size << 3);
      ppIVar45 = (pIVar13->CurrentWindowStack).Data;
      if (ppIVar45 == (ImGuiWindow **)0x0) {
        ppIVar45 = (ImGuiWindow **)0x0;
      }
      else {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
    }
    (*GImAllocatorFreeFunc)(ppIVar45,GImAllocatorUserData);
    (pIVar13->CurrentWindowStack).Data = __dest;
    (pIVar13->CurrentWindowStack).Capacity = 0;
  }
  (pIVar13->CurrentWindowStack).Size = 0;
  if ((pIVar13->CurrentPopupStack).Capacity < 0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    pIVar46 = (ImGuiPopupRef *)0x0;
    __dest_00 = (ImGuiPopupRef *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    __src = (pIVar13->CurrentPopupStack).Data;
    if (__src != (ImGuiPopupRef *)0x0) {
      memcpy(__dest_00,__src,(long)(pIVar13->CurrentPopupStack).Size * 0x30);
      pIVar46 = (pIVar13->CurrentPopupStack).Data;
      if (pIVar46 == (ImGuiPopupRef *)0x0) {
        pIVar46 = (ImGuiPopupRef *)0x0;
      }
      else {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
    }
    (*GImAllocatorFreeFunc)(pIVar46,GImAllocatorUserData);
    (pIVar13->CurrentPopupStack).Data = __dest_00;
    (pIVar13->CurrentPopupStack).Capacity = 0;
  }
  (pIVar13->CurrentPopupStack).Size = 0;
  ClosePopupsOverWindow(pIVar13->NavWindow);
  pIVar13 = GImGui;
  (pIVar13->NextWindowData).SizeVal.x = 400.0;
  (pIVar13->NextWindowData).SizeVal.y = 400.0;
  (pIVar13->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  return;
  while( true ) {
    pcVar43 = pcVar43 + 1;
    lVar34 = lVar34 + -1;
    if (lVar34 == 0) break;
LAB_0014a98e:
    if (pcVar43[-1] == '[') {
      pcVar23[-1] = '\0';
      pcVar23 = pcVar30 + 1;
      goto LAB_0014a9a7;
    }
  }
LAB_0014a99d:
  pcVar23 = "Window";
  pcVar43 = pcVar30 + 1;
LAB_0014a9a7:
  pIVar24 = FindSettingsHandler(pcVar23);
  if (pIVar24 == (ImGuiSettingsHandler *)0x0) {
    pIVar24 = (ImGuiSettingsHandler *)0x0;
    pvVar25 = (void *)0x0;
  }
  else {
    pvVar25 = (*pIVar24->ReadOpenFn)(pIVar14,pIVar24,pcVar43);
  }
LAB_0014a97b:
  pcVar30 = pcVar44 + 1;
  if (pcVar42 <= pcVar30) goto LAB_0014a9d5;
  goto LAB_0014a8cb;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() or ImGui::SetCurrentContext()?");
    ImGuiContext& g = *GImGui;

    // Check user data
    // (We pass an error message in the assert expression to make it visible to programmers who are not using a debugger, as most assert handlers display their argument)
    IM_ASSERT(g.Initialized);
    IM_ASSERT(g.IO.DeltaTime >= 0.0f                                    && "Need a positive DeltaTime (zero is tolerated but will cause some timing issues)");
    IM_ASSERT(g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f  && "Invalid DisplaySize value");
    IM_ASSERT(g.IO.Fonts->Fonts.Size > 0                                && "Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?");
    IM_ASSERT(g.IO.Fonts->Fonts[0]->IsLoaded()                          && "Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?");
    IM_ASSERT(g.Style.CurveTessellationTol > 0.0f                       && "Invalid style setting");
    IM_ASSERT(g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f            && "Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)");
    IM_ASSERT((g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount)  && "Forgot to call Render() or EndFrame() at the end of the previous frame?");
    for (int n = 0; n < ImGuiKey_COUNT; n++)
        IM_ASSERT(g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < IM_ARRAYSIZE(g.IO.KeysDown) && "io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)");

    // Perform simple check for required key mapping (we intentionally do NOT check all keys to not pressure user into setting up everything, but Space is required and was only recently added in 1.60 WIP)
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard)
        IM_ASSERT(g.IO.KeyMap[ImGuiKey_Space] != -1 && "ImGuiKey_Space is not mapped, required for keyboard navigation.");

    // Load settings on first frame
    if (!g.SettingsLoaded)
    {
        IM_ASSERT(g.SettingsWindows.empty());
        LoadIniSettingsFromDisk(g.IO.IniFilename);
        g.SettingsLoaded = true;
    }

    // Save settings (with a delay so we don't spam disk too much)
    if (g.SettingsDirtyTimer > 0.0f)
    {
        g.SettingsDirtyTimer -= g.IO.DeltaTime;
        if (g.SettingsDirtyTimer <= 0.0f)
            SaveIniSettingsToDisk(g.IO.IniFilename);
    }

    g.Time += g.IO.DeltaTime;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;

    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(0.0f, 0.0f, g.IO.DisplaySize.x, g.IO.DisplaySize.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;

    g.OverlayDrawList.Clear();
    g.OverlayDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.OverlayDrawList.PushClipRectFullScreen();
    g.OverlayDrawList.Flags = (g.Style.AntiAliasedLines ? ImDrawListFlags_AntiAliasedLines : 0) | (g.Style.AntiAliasedFill ? ImDrawListFlags_AntiAliasedFill : 0);

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it
    g.DrawData.Clear();

    // Clear reference to active widget if the widget isn't alive anymore
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    if (!g.ActiveIdIsAlive && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.ScalarAsInputTextId && g.ActiveId != g.ScalarAsInputTextId)
        g.ScalarAsInputTextId = 0;

    // Elapse drag & drop payload
    if (g.DragDropActive && g.DragDropPayload.DataFrameCount + 1 < g.FrameCount)
    {
        ClearDragDrop();
        g.DragDropPayloadBufHeap.clear();
        memset(&g.DragDropPayloadBufLocal, 0, sizeof(g.DragDropPayloadBufLocal));
    }
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;

    // Update keyboard input state
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard directional navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMovingWindow();
    NewFrameUpdateHoveredWindowAndCaptureFlags();
    
    if (GetFrontMostPopupModal() != NULL)
        g.ModalWindowDarkeningRatio = ImMin(g.ModalWindowDarkeningRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.ModalWindowDarkeningRatio = 0.0f;

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    if (g.HoveredWindow && !g.HoveredWindow->Collapsed && (g.IO.MouseWheel != 0.0f || g.IO.MouseWheelH != 0.0f))
    {
        // If a child window has the ImGuiWindowFlags_NoScrollWithMouse flag, we give a chance to scroll its parent (unless either ImGuiWindowFlags_NoInputs or ImGuiWindowFlags_NoScrollbar are also set).
        ImGuiWindow* window = g.HoveredWindow;
        ImGuiWindow* scroll_window = window;
        while ((scroll_window->Flags & ImGuiWindowFlags_ChildWindow) && (scroll_window->Flags & ImGuiWindowFlags_NoScrollWithMouse) && !(scroll_window->Flags & ImGuiWindowFlags_NoScrollbar) && !(scroll_window->Flags & ImGuiWindowFlags_NoInputs) && scroll_window->ParentWindow)
            scroll_window = scroll_window->ParentWindow;
        const bool scroll_allowed = !(scroll_window->Flags & ImGuiWindowFlags_NoScrollWithMouse) && !(scroll_window->Flags & ImGuiWindowFlags_NoInputs);

        if (g.IO.MouseWheel != 0.0f)
        {
            if (g.IO.KeyCtrl && g.IO.FontAllowUserScaling)
            {
                // Zoom / Scale window
                const float new_font_scale = ImClamp(window->FontWindowScale + g.IO.MouseWheel * 0.10f, 0.50f, 2.50f);
                const float scale = new_font_scale / window->FontWindowScale;
                window->FontWindowScale = new_font_scale;

                const ImVec2 offset = window->Size * (1.0f - scale) * (g.IO.MousePos - window->Pos) / window->Size;
                window->Pos += offset;
                window->Size *= scale;
                window->SizeFull *= scale;
            }
            else if (!g.IO.KeyCtrl && scroll_allowed)
            {
                // Mouse wheel vertical scrolling
                float scroll_amount = 5 * scroll_window->CalcFontSize();
                scroll_amount = (float)(int)ImMin(scroll_amount, (scroll_window->ContentsRegionRect.GetHeight() + scroll_window->WindowPadding.y * 2.0f) * 0.67f);
                SetWindowScrollY(scroll_window, scroll_window->Scroll.y - g.IO.MouseWheel * scroll_amount);
            }
        }
        if (g.IO.MouseWheelH != 0.0f && scroll_allowed)
        {
            // Mouse wheel horizontal scrolling (for hardware that supports it)
            float scroll_amount = scroll_window->CalcFontSize();
            if (!g.IO.KeyCtrl && !(window->Flags & ImGuiWindowFlags_NoScrollWithMouse))
                SetWindowScrollX(window, window->Scroll.x - g.IO.MouseWheelH * scroll_amount);
        }
    }

    // Pressing TAB activate widget focus
    if (g.ActiveId == 0 && g.NavWindow != NULL && g.NavWindow->Active && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs) && !g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab, false))
    {
        if (g.NavId != 0 && g.NavIdTabCounter != INT_MAX)
            g.NavWindow->FocusIdxTabRequestNext = g.NavIdTabCounter + 1 + (g.IO.KeyShift ? -1 : 1);
        else
            g.NavWindow->FocusIdxTabRequestNext = g.IO.KeyShift ? -1 : 0;
    }
    g.NavIdTabCounter = INT_MAX;

    // Mark all windows as not visible
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->Active = false;
        window->WriteAccessed = false;
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusFrontMostActiveWindow(NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.CurrentPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow);

    // Create implicit window - we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    SetNextWindowSize(ImVec2(400,400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
}